

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddMatMult.c
# Opt level: O0

DdNode * Cudd_addMatrixMultiply(DdManager *dd,DdNode *A,DdNode *B,DdNode **z,int nz)

{
  int iVar1;
  int *vars_00;
  DdNode *res;
  int *vars;
  int local_38;
  int nvars;
  int i;
  int nz_local;
  DdNode **z_local;
  DdNode *B_local;
  DdNode *A_local;
  DdManager *dd_local;
  
  iVar1 = dd->size;
  vars_00 = (int *)malloc((long)iVar1 << 2);
  if (vars_00 == (int *)0x0) {
    dd->errorCode = CUDD_MEMORY_OUT;
    dd_local = (DdManager *)0x0;
  }
  else {
    for (local_38 = 0; local_38 < iVar1; local_38 = local_38 + 1) {
      vars_00[local_38] = 0;
    }
    for (local_38 = 0; local_38 < nz; local_38 = local_38 + 1) {
      vars_00[z[local_38]->index] = 1;
    }
    do {
      dd->reordered = 0;
      dd_local = (DdManager *)addMMRecur(dd,A,B,-1,vars_00);
    } while (dd->reordered == 1);
    if (vars_00 != (int *)0x0) {
      free(vars_00);
    }
  }
  return &dd_local->sentinel;
}

Assistant:

DdNode *
Cudd_addMatrixMultiply(
  DdManager * dd,
  DdNode * A,
  DdNode * B,
  DdNode ** z,
  int  nz)
{
    int i, nvars, *vars;
    DdNode *res; 

    /* Array vars says what variables are "summation" variables. */
    nvars = dd->size;
    vars = ABC_ALLOC(int,nvars);
    if (vars == NULL) {
        dd->errorCode = CUDD_MEMORY_OUT;
        return(NULL);
    }
    for (i = 0; i < nvars; i++) {
        vars[i] = 0;
    }
    for (i = 0; i < nz; i++) {
        vars[z[i]->index] = 1;
    }

    do {
        dd->reordered = 0;
        res = addMMRecur(dd,A,B,-1,vars);
    } while (dd->reordered == 1);
    ABC_FREE(vars);
    return(res);

}